

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::generalizedGravityForces
          (KinDynComputations *this,Span<double,__1L> generalizedGravityForces)

{
  long lVar1;
  SpatialForceVector *vec;
  VectorDynSize *vec_00;
  pointer peVar2;
  extent_type<_1L> eVar3;
  Matrix<double,_6,_1,_0,_6,_1> MStack_a8;
  undefined1 local_78 [24];
  pointer local_60;
  long local_58;
  variable_if_dynamic<long,__1> local_50;
  variable_if_dynamic<long,__1> local_48;
  long local_40;
  long local_38;
  
  peVar2 = generalizedGravityForces.storage_.data_;
  eVar3 = generalizedGravityForces.storage_.super_extent_type<_1L>.size_;
  lVar1 = iDynTree::Model::getNrOfDOFs();
  if (lVar1 + 6 == eVar3.size_) {
    KinDynComputations::generalizedGravityForces(this,&this->pimpl->m_generalizedForcesContainer);
    vec = (SpatialForceVector *)iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
    toEigen(&MStack_a8,vec);
    local_50.m_value = 0;
    local_78._0_8_ = peVar2;
    local_78._16_8_ = peVar2;
    local_60 = (pointer)eVar3.size_;
    local_40 = eVar3.size_;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,6,1,false>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_6,_1,_false>
                *)local_78,&MStack_a8);
    vec_00 = (VectorDynSize *)iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&MStack_a8,
            vec_00);
    local_78._8_8_ = iDynTree::Model::getNrOfDOFs();
    local_48.m_value = eVar3.size_ - local_78._8_8_;
    local_78._0_8_ = peVar2 + local_48.m_value;
    local_60 = peVar2;
    local_58 = eVar3.size_;
    local_38 = eVar3.size_;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
                *)local_78,
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&MStack_a8);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","generalizedGravityForces",
               "Wrong size in input generalizedBiasForces");
  }
  return lVar1 + 6 == eVar3.size_;
}

Assistant:

bool KinDynComputations::generalizedGravityForces(Span<double> generalizedGravityForces)
{
    bool ok = generalizedGravityForces.size() == pimpl->m_robot_model.getNrOfDOFs() + 6;

    if( !ok )
    {
        reportError("KinDynComputations","generalizedGravityForces","Wrong size in input generalizedBiasForces");
        return false;
    }

    ok = this->generalizedGravityForces(pimpl->m_generalizedForcesContainer);

    if( !ok )
    {
        reportError("KinDynComputations","generalizedGravityForces","Unable to compute the bias forces");
        return false;
    }

    toEigen(generalizedGravityForces).head<6>() = toEigen(pimpl->m_generalizedForcesContainer.baseWrench());
    toEigen(generalizedGravityForces).tail(pimpl->m_robot_model.getNrOfDOFs()) = toEigen(pimpl->m_generalizedForcesContainer.jointTorques());

    return true;
}